

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

iterator __thiscall
llvm::SmallVectorImpl<char>::insert<char_const*,void>
          (SmallVectorImpl<char> *this,iterator I,char *From,char *To)

{
  void *pvVar1;
  ulong uVar2;
  iterator pcVar3;
  move_iterator<char_*> in_end;
  ulong uVar4;
  ulong __n;
  ulong __n_00;
  size_t __n_01;
  
  pcVar3 = (iterator)
           (this->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar4 = (long)I - (long)pcVar3;
  uVar2 = (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  if (pcVar3 + uVar2 == I) {
    append<char_const*,void>(this,From,To);
    pcVar3 = (iterator)
             (uVar4 + (long)(this->super_SmallVectorTemplateBase<char,_true>).
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
             );
  }
  else {
    if (I < pcVar3) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x259,
                    "iterator llvm::SmallVectorImpl<char>::insert(iterator, ItTy, ItTy) [T = char, ItTy = const char *]"
                   );
    }
    if (pcVar3 + uVar2 < I) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x25a,
                    "iterator llvm::SmallVectorImpl<char>::insert(iterator, ItTy, ItTy) [T = char, ItTy = const char *]"
                   );
    }
    __n = (long)To - (long)From;
    reserve(this,uVar2 + __n);
    pvVar1 = (this->super_SmallVectorTemplateBase<char,_true>).
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    pcVar3 = (iterator)((long)pvVar1 + uVar4);
    uVar2 = (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    in_end._M_current = (char *)((long)pvVar1 + uVar2);
    __n_00 = uVar2 - uVar4;
    if (__n_00 < __n) {
      SmallVectorBase::set_size((SmallVectorBase *)this,__n + uVar2);
      if (uVar2 != uVar4) {
        memcpy((void *)((long)(this->super_SmallVectorTemplateBase<char,_true>).
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                              BeginX +
                       ((this->super_SmallVectorTemplateBase<char,_true>).
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size -
                       __n_00)),pcVar3,__n_00);
      }
      for (uVar2 = 0; __n_00 != uVar2; uVar2 = uVar2 + 1) {
        pcVar3[uVar2] = From[uVar2];
      }
      if (From + uVar2 != To) {
        memcpy(in_end._M_current,From + uVar2,__n - uVar2);
      }
    }
    else {
      append<std::move_iterator<char*>,void>
                (this,(move_iterator<char_*>)(in_end._M_current + -__n),in_end);
      __n_01 = (long)(in_end._M_current + -__n) - (long)pcVar3;
      if (__n_01 != 0) {
        memmove(in_end._M_current + -__n_01,pcVar3,__n_01);
      }
      if (To != From) {
        pcVar3 = (iterator)memmove(pcVar3,From,__n);
        return pcVar3;
      }
    }
  }
  return pcVar3;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->set_size(this->size() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }